

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void DeserializePrimitives(CJSON *json)

{
  PrimitiveTestClass ret;
  PrimitiveTestClass ptc;
  string local_238;
  PrimitiveTestClass local_218;
  PrimitiveTestClass local_118;
  
  local_118.SIZE = 10;
  memset(&local_118.str,0,0x98);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,
             "{\"c\":-1,\"d\":432.324324,\"f\":1.342323,\"i\":1048575,\"l\":1048575,\"ld\":423432.346544,\"ll\":1048575,\"pc\":[-1,-1,-1,-1,-1,-1,-1,-1,-1,-1],\"pd\":[255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000],\"pf\":[255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000],\"pi\":[255,255,255,255,255,255,255,255,255,255],\"pl\":[255,255,255,255,255,255,255,255,255,255],\"pld\":[255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000],\"pll\":[255,255,255,255,255,255,255,255,255,255],\"ps\":[255,255,255,255,255,255,255,255,255,255],\"pto\":[{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"}],\"puc\":[255,255,255,255,255,255,255,255,255,255],\"pui\":[255,255,255,255,255,255,255,255,255,255],\"pul\":[255,255,255,255,255,255,255,255,255,255],\"pull\":[255,255,255,255,255,255,255,255,255,255],\"pus\":[255,255,255,255,255,255,255,255,255,255],\"s\":-1,\"str\":\"Hello World!\",\"uc\":255,\"ui\":1048575,\"ul\":1048575,\"ull\":1048575,\"us\":65535, \"spi\":[10,10,10,10,10,10,10,10,10,10], \"spto\":[{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"}]}"
             ,"");
  CJSON::ParseObject(json,&local_238);
  local_218.SIZE = 10;
  memset(&local_218.str,0,0x98);
  PrimitiveTestClass::Deserialize(&local_218,json);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)json);
  PrimitiveTestClass::operator=(&local_118,&local_218);
  PrimitiveTestClass::~PrimitiveTestClass(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"PrimitiveTestClass: ",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  PrimitiveTestClass::Print(&local_118);
  PrimitiveTestClass::~PrimitiveTestClass(&local_118);
  return;
}

Assistant:

void DeserializePrimitives(CJSON &json)
{
    PrimitiveTestClass ptc;
    ptc = json.Deserialize<PrimitiveTestClass>("{\"c\":-1,\"d\":432.324324,\"f\":1.342323,\"i\":1048575,\"l\":1048575,\"ld\":423432.346544,\"ll\":1048575,\"pc\":[-1,-1,-1,-1,-1,-1,-1,-1,-1,-1],\"pd\":[255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000],\"pf\":[255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000],\"pi\":[255,255,255,255,255,255,255,255,255,255],\"pl\":[255,255,255,255,255,255,255,255,255,255],\"pld\":[255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000],\"pll\":[255,255,255,255,255,255,255,255,255,255],\"ps\":[255,255,255,255,255,255,255,255,255,255],\"pto\":[{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"}],\"puc\":[255,255,255,255,255,255,255,255,255,255],\"pui\":[255,255,255,255,255,255,255,255,255,255],\"pul\":[255,255,255,255,255,255,255,255,255,255],\"pull\":[255,255,255,255,255,255,255,255,255,255],\"pus\":[255,255,255,255,255,255,255,255,255,255],\"s\":-1,\"str\":\"Hello World!\",\"uc\":255,\"ui\":1048575,\"ul\":1048575,\"ull\":1048575,\"us\":65535, \"spi\":[10,10,10,10,10,10,10,10,10,10], \"spto\":[{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"}]}");
    cout << "PrimitiveTestClass: " << endl;
    ptc.Print();
}